

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

int __thiscall TestHarness::PickType(TestHarness *this)

{
  uint uVar1;
  size_type_conflict sVar2;
  reference pvVar3;
  undefined8 uVar4;
  int local_20;
  int local_1c;
  int i;
  int v;
  TestHarness *this_local;
  
  if (this->num_tests_ < 50000) {
    this->num_tests_ = this->num_tests_ + 1;
    if (this->total_weight_ < 1) {
      syscall(1,2,"Check failed: total_weight_ > 0\n",0x20);
      abort();
    }
    local_1c = Uniform(this,this->total_weight_);
    for (local_20 = 0;
        sVar2 = std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::size
                          (&this->types_), (ulong)(long)local_20 < sVar2; local_20 = local_20 + 1) {
      pvVar3 = std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::operator[]
                         (&this->types_,(long)local_20);
      local_1c = local_1c - pvVar3->weight;
      if (local_1c < 0) break;
    }
    sVar2 = std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::size(&this->types_);
    if (sVar2 <= (ulong)(long)local_20) {
      syscall(1,2,"Check failed: i < types_.size()\n",0x20);
      abort();
    }
    if (this->num_tests_ % 50000 == 0) {
      uVar1 = this->num_tests_;
      std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::operator[]
                (&this->types_,(long)local_20);
      uVar4 = std::__cxx11::string::c_str();
      printf("  Test %d out of %d: %s\n",(ulong)uVar1,50000,uVar4);
    }
    pvVar3 = std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::operator[]
                       (&this->types_,(long)local_20);
    this_local._4_4_ = pvVar3->type;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int TestHarness::PickType() {
  if (num_tests_ >= FLAGS_numtests) return -1;
  num_tests_++;

  CHECK(total_weight_ > 0);
  // This is a little skewed if total_weight_ doesn't divide 2^31, but it's close
  int v = Uniform(total_weight_);
  int i;
  for (i = 0; i < types_.size(); i++) {
    v -= types_[i].weight;
    if (v < 0) {
      break;
    }
  }

  CHECK(i < types_.size());
  if ((num_tests_ % FLAGS_log_every_n_tests) == 0) {
    printf("  Test %d out of %d: %s\n",
            num_tests_, FLAGS_numtests, types_[i].name.c_str());
  }
  return types_[i].type;
}